

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAX2.c
# Opt level: O1

void xmlSAX2ErrMemory(xmlParserCtxtPtr ctxt,char *msg)

{
  _xmlSAXHandler *p_Var1;
  xmlStructuredErrorFunc schannel;
  
  ctxt->errNo = 2;
  p_Var1 = ctxt->sax;
  if ((p_Var1 == (_xmlSAXHandler *)0x0) || (p_Var1->initialized != 0xdeedbeaf)) {
    schannel = (xmlStructuredErrorFunc)0x0;
  }
  else {
    schannel = p_Var1->serror;
  }
  __xmlRaiseError(schannel,(ctxt->vctxt).error,(ctxt->vctxt).userData,ctxt,(void *)0x0,1,2,
                  XML_ERR_ERROR,(char *)0x0,0,"out of memory\n",(char *)0x0,(char *)0x0,0,0,msg,
                  "out of memory\n",0);
  ctxt->errNo = 2;
  ctxt->instate = XML_PARSER_EOF;
  ctxt->disableSAX = 1;
  return;
}

Assistant:

static void LIBXML_ATTR_FORMAT(2,0)
xmlSAX2ErrMemory(xmlParserCtxtPtr ctxt, const char *msg) {
    xmlStructuredErrorFunc schannel = NULL;
    const char *str1 = "out of memory\n";

    if (ctxt != NULL) {
	ctxt->errNo = XML_ERR_NO_MEMORY;
	if ((ctxt->sax != NULL) && (ctxt->sax->initialized == XML_SAX2_MAGIC))
	    schannel = ctxt->sax->serror;
	__xmlRaiseError(schannel,
			ctxt->vctxt.error, ctxt->vctxt.userData,
			ctxt, NULL, XML_FROM_PARSER, XML_ERR_NO_MEMORY,
			XML_ERR_ERROR, NULL, 0, (const char *) str1,
			NULL, NULL, 0, 0,
			msg, (const char *) str1, NULL);
	ctxt->errNo = XML_ERR_NO_MEMORY;
	ctxt->instate = XML_PARSER_EOF;
	ctxt->disableSAX = 1;
    }